

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::FillerParameter::FillerParameter(FillerParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FillerParameter_0071c470;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (this != (FillerParameter *)&_FillerParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  caffe::FillerParameter((caffe *)this);
  return;
}

Assistant:

FillerParameter::FillerParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.FillerParameter)
}